

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O3

void __thiscall
HermiteSpline<3U,_2U>::walk
          (HermiteSpline<3U,_2U> *this,double deltatau,
          _func_void_VectorNd_HermiteSpline<3U,_2U>_ptr_double_Polynomial_ptr_void_ptr *fn,
          void *payload)

{
  bool bVar1;
  bool bVar2;
  pointer pUVar3;
  long lVar4;
  ulong uVar5;
  pointer *ppUVar6;
  long lVar7;
  ulong uVar8;
  pointer pUVar9;
  double dVar10;
  double dVar11;
  VectorNd VVar12;
  pointer local_68;
  double local_60;
  double local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  
  pUVar3 = (this->children).
           super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->children).
      super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pUVar3) {
    uVar8 = 0;
    local_58 = 0.0;
    local_60 = deltatau;
    do {
      pUVar3 = pUVar3 + uVar8;
      VVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
           = local_58 / pUVar3->length;
      lVar4 = 0;
      ppUVar6 = &local_68;
      bVar1 = true;
      do {
        bVar2 = bVar1;
        pUVar9 = (pointer)0x0;
        lVar7 = 0;
        dVar10 = 1.0;
        do {
          dVar11 = VVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                   m_data.array[0] * dVar10;
          pUVar9 = (pointer)((double)pUVar9 + dVar10 * pUVar3->_dims[lVar4].coeffs[lVar7]);
          lVar7 = lVar7 + 1;
          dVar10 = dVar11;
        } while (lVar7 != 4);
        *ppUVar6 = pUVar9;
        lVar4 = 1;
        ppUVar6 = &local_50;
        bVar1 = false;
      } while (bVar2);
      local_48 = local_68;
      local_40 = local_50;
      VVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
           = (double)local_50;
      (*fn)(VVar12,(HermiteSpline<3U,_2U> *)&local_48,dVar11,(Polynomial *)this,pUVar3);
      dVar10 = local_58 + local_60;
      pUVar3 = (this->children).
               super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = dVar10 != pUVar3[uVar8].length;
      bVar2 = pUVar3[uVar8].length <= dVar10;
      local_58 = 0.0;
      if (!bVar2 || !bVar1) {
        local_58 = dVar10;
      }
      uVar8 = (ulong)((int)uVar8 + (uint)(bVar2 && bVar1));
      uVar5 = ((long)(this->children).
                     super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3 >> 3) *
              -0x71c71c71c71c71c7;
    } while (uVar8 <= uVar5 && uVar5 - uVar8 != 0);
  }
  return;
}

Assistant:

void HermiteSpline<Order, Dims>::walk(const double deltatau, void (*fn)(VectorNd, HermiteSpline<Order, Dims>&, double, UnitBoundedPolynomial<Order, Dims>&, void *), void *payload)
{
    double tau = 0.0;
    int m = 0;

    while (m < children.size())
    {
        double reltau = tau / children[m].length;
        VectorNd pt = children[m].interpolate(reltau);

        fn(pt, *this, reltau, children[m], payload);
        tau += deltatau;

        if (tau > children[m].length)
        {
            tau = 0.0;
            m++;
        }
    }
}